

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<float>::copyFromArray
          (btAlignedObjectArray<float> *this,btAlignedObjectArray<float> *otherArray)

{
  uint newsize;
  float local_1c;
  
  newsize = otherArray->m_size;
  local_1c = 0.0;
  resize(this,newsize,&local_1c);
  copy(otherArray,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)newsize);
  return;
}

Assistant:

void copyFromArray(const btAlignedObjectArray& otherArray)
	{
		int otherSize = otherArray.size();
		resize (otherSize);
		otherArray.copy(0, otherSize, m_data);
	}